

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void Diffusion::computeAlpha
               (MultiFab *alpha,pair<double,_double> *scalars,Real a,Real b,Real *rhsscale,
               MultiFab *alpha_in,int alpha_in_comp,int rho_flag,MultiFab *rho,int rho_comp)

{
  Real RVar1;
  double dVar2;
  undefined8 local_58;
  undefined8 local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  local_58 = 1;
  local_50 = 0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(alpha->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
            (alpha,&(rho->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(rho->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
             &local_58,
             (rho->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  if (alpha_in == (MultiFab *)0x0) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&alpha->super_FabArray<amrex::FArrayBox>,1.0);
  }
  else {
    amrex::MultiFab::Copy(alpha,alpha_in,alpha_in_comp,0,1,0);
  }
  if (0 < rho_flag) {
    amrex::MultiFab::Multiply(alpha,rho,rho_comp,0,1,0);
  }
  if (rhsscale == (Real *)0x0) {
    scalars->first = a;
  }
  else {
    if (scale_abec == 0) {
      dVar2 = 1.0;
    }
    else {
      RVar1 = amrex::MultiFab::max(alpha,0,0,false);
      dVar2 = 1.0 / RVar1;
    }
    *rhsscale = dVar2;
    scalars->first = a * dVar2;
    b = b * *rhsscale;
  }
  scalars->second = b;
  return;
}

Assistant:

void
Diffusion::computeAlpha (MultiFab&             alpha,
                         std::pair<Real,Real>& scalars,
                         Real                  a,
                         Real                  b,
                         Real*                 rhsscale,
                         const MultiFab*       alpha_in,
                         int                   alpha_in_comp,
                         int                   rho_flag,
                         const MultiFab*       rho,
                         int                   rho_comp)
{
    const BoxArray& ba = rho->boxArray();
    const DistributionMapping& dm = rho->DistributionMap();
    const auto& factory = rho->Factory();

    alpha.define(ba, dm, 1, 0, MFInfo(), factory);

    if (alpha_in != 0)
    {
        BL_ASSERT(alpha_in_comp >= 0 && alpha_in_comp < alpha.nComp());
        MultiFab::Copy(alpha,*alpha_in,alpha_in_comp,0,1,0);
    }
    else
      alpha.setVal(1.0);

    if ( rho_flag > 0 )
    {
        MultiFab::Multiply(alpha,*rho,rho_comp,0,1,0);
    }

    if (rhsscale != 0)
    {
        *rhsscale = scale_abec ? 1.0/alpha.max(0) : 1.0;

        scalars.first = a*(*rhsscale);
        scalars.second = b*(*rhsscale);
    }
    else
    {
        scalars.first = a;
        scalars.second = b;
    }
}